

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O2

void cpu_gl_switch_gregs_sparc64(CPUSPARCState_conflict1 *env,uint32_t new_gl)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = (new_gl & 7) << 3;
  uVar1 = (env->gl & 7) << 3;
  if (uVar2 == uVar1) {
    return;
  }
  memcpy32(env->glregs + uVar1,env->gregs);
  memcpy32(env->gregs,env->glregs + uVar2);
  return;
}

Assistant:

static inline uint64_t *get_gl_gregset(CPUSPARCState *env, uint32_t gl)
{
    return env->glregs + (gl & 7) * 8;
}